

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  archive_string *as;
  archive_string *as_00;
  byte bVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  ulong uVar5;
  size_t sVar6;
  int64_t iVar7;
  byte *pbVar8;
  archive_string_conv *paVar9;
  archive_acl *paVar10;
  byte *value;
  long lVar11;
  dev_t dVar12;
  archive_string *paVar13;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  char *pcVar17;
  byte bVar18;
  uint uVar19;
  wchar_t wVar20;
  size_t sVar21;
  ulong uVar22;
  byte *pbVar23;
  bool bVar24;
  wchar_t local_c4;
  byte *local_90;
  long local_70;
  long local_68;
  int64_t s;
  int64_t *local_58;
  wchar_t local_4c;
  byte *local_48;
  char *local_40;
  byte *local_38;
  
  wVar2 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar2 != L'\0') {
    return wVar2;
  }
  wVar2 = tar_read_header(a,tar,entry,unconsumed);
  if ((wVar2 != L'\0') && (wVar2 != L'\xffffffec')) {
    return wVar2;
  }
  pbVar15 = (byte *)(tar->pax_header).s;
  uVar5 = strlen((char *)pbVar15);
  tar->pax_hdrcharset_binary = 0;
  (tar->entry_gname).length = 0;
  (tar->entry_linkpath).length = 0;
  paVar13 = &tar->entry_gname;
  (tar->entry_pathname).length = 0;
  as = &tar->entry_linkpath;
  (tar->entry_pathname_override).length = 0;
  (tar->entry_uname).length = 0;
  as_00 = &tar->entry_uname;
  local_58 = &tar->sparse_offset;
  local_40 = "Can\'t allocate memory for SCHILY.acl.default";
  local_c4 = L'\0';
LAB_003f4726:
  if (uVar5 == 0) goto LAB_003f55ae;
  uVar22 = 0;
  uVar14 = uVar5;
  pbVar23 = pbVar15;
  while( true ) {
    bVar24 = uVar14 == 0;
    uVar14 = uVar14 - 1;
    local_90 = pbVar15 + uVar5;
    local_38 = pbVar15;
    if ((bVar24) || (bVar18 = *pbVar23, local_90 = pbVar23 + 1, bVar18 == 0x20)) break;
    if ((byte)(bVar18 - 0x3a) < 0xf6) {
      pcVar17 = "Ignoring malformed pax extended attributes";
      goto LAB_003f5572;
    }
    uVar22 = (ulong)(byte)(bVar18 - 0x30) + uVar22 * 10;
    pbVar23 = pbVar23 + 1;
    if (999999 < uVar22) {
      pcVar17 = "Rejecting pax extended attribute > 1MB";
      goto LAB_003f5572;
    }
  }
  uVar14 = uVar22 - 1;
  if ((uVar5 <= uVar14) || (pbVar15[uVar14] != 10)) {
    pcVar17 = "Ignoring malformed pax extended attribute";
LAB_003f5572:
    archive_set_error(&a->archive,-1,pcVar17);
    local_c4 = L'\xffffffec';
    goto LAB_003f5582;
  }
  pbVar15[uVar14] = 0;
  bVar18 = *local_90;
  pbVar15 = local_90;
  if (bVar18 == 0x3d) {
    local_c4 = L'\xffffffff';
    goto LAB_003f5582;
  }
  while( true ) {
    pbVar23 = pbVar15 + 1;
    if (bVar18 == 0) {
      pcVar17 = "Invalid pax extended attributes";
      goto LAB_003f5572;
    }
    if (bVar18 == 0x3d) break;
    bVar18 = *pbVar23;
    pbVar15 = pbVar23;
  }
  *pbVar15 = 0;
  bVar18 = *local_90;
  wVar20 = L'\0';
  wVar4 = L'\0';
  switch(bVar18) {
  case 0x61:
    iVar3 = strcmp((char *)local_90,"atime");
    wVar4 = wVar20;
    if (iVar3 == 0) {
      pax_time((char *)pbVar23,&s,&local_68);
      archive_entry_set_atime(entry,s,local_68);
    }
    break;
  case 0x62:
  case 100:
  case 0x65:
  case 0x66:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x74:
    break;
  case 99:
    iVar3 = strcmp((char *)local_90,"ctime");
    wVar4 = wVar20;
    if (iVar3 == 0) {
      pax_time((char *)pbVar23,&s,&local_68);
      archive_entry_set_ctime(entry,s,local_68);
    }
    break;
  case 0x67:
    iVar3 = strcmp((char *)local_90,"gid");
    if (iVar3 == 0) {
      sVar6 = strlen((char *)pbVar23);
      iVar7 = tar_atol10((char *)pbVar23,sVar6);
      archive_entry_set_gid(entry,iVar7);
    }
    else {
      iVar3 = strcmp((char *)local_90,"gname");
      if (iVar3 == 0) {
        (tar->entry_gname).length = 0;
        sVar6 = strlen((char *)pbVar23);
        archive_strncat(paVar13,pbVar23,sVar6);
      }
    }
    goto LAB_003f53cd;
  case 0x68:
    iVar3 = strcmp((char *)local_90,"hdrcharset");
    wVar4 = wVar20;
    if (iVar3 == 0) {
      iVar3 = strcmp((char *)pbVar23,"BINARY");
      if (iVar3 == 0) {
        tar->pax_hdrcharset_binary = 1;
      }
      else {
        iVar3 = strcmp((char *)pbVar23,"ISO-IR 10646 2000 UTF-8");
        if (iVar3 == 0) {
          tar->pax_hdrcharset_binary = 0;
        }
      }
    }
    break;
  case 0x6c:
    iVar3 = strcmp((char *)local_90,"linkpath");
    wVar4 = wVar20;
    if (iVar3 == 0) {
      (tar->entry_linkpath).length = 0;
      sVar6 = strlen((char *)pbVar23);
      archive_strncat(as,pbVar23,sVar6);
      wVar4 = L'\0';
    }
    break;
  case 0x6d:
    iVar3 = strcmp((char *)local_90,"mtime");
    wVar4 = wVar20;
    if (iVar3 == 0) {
      pax_time((char *)pbVar23,&s,&local_68);
      archive_entry_set_mtime(entry,s,local_68);
    }
    break;
  case 0x70:
    iVar3 = strcmp((char *)local_90,"path");
    wVar4 = wVar20;
    if (iVar3 == 0) {
      (tar->entry_pathname).length = 0;
      sVar6 = strlen((char *)pbVar23);
      archive_strncat(&tar->entry_pathname,pbVar23,sVar6);
      wVar4 = L'\0';
    }
    break;
  case 0x73:
    iVar3 = strcmp((char *)local_90,"size");
    wVar4 = wVar20;
    if (iVar3 == 0) {
      sVar6 = strlen((char *)pbVar23);
      iVar7 = tar_atol10((char *)pbVar23,sVar6);
      tar->entry_bytes_remaining = iVar7;
      if (tar->realsize < 0) {
        archive_entry_set_size(entry,iVar7);
        tar->realsize = tar->entry_bytes_remaining;
      }
    }
    break;
  case 0x75:
    iVar3 = strcmp((char *)local_90,"uid");
    if (iVar3 == 0) {
      sVar6 = strlen((char *)pbVar23);
      iVar7 = tar_atol10((char *)pbVar23,sVar6);
      archive_entry_set_uid(entry,iVar7);
    }
    else {
      iVar3 = strcmp((char *)local_90,"uname");
      if (iVar3 == 0) {
        (tar->entry_uname).length = 0;
        sVar6 = strlen((char *)pbVar23);
        archive_strncat(as_00,pbVar23,sVar6);
      }
    }
    goto LAB_003f53cd;
  default:
    if (bVar18 != 0x53) {
      if (bVar18 == 0x4c) {
        iVar3 = strcmp((char *)local_90,"LIBARCHIVE.creationtime");
        if (iVar3 == 0) {
          pax_time((char *)pbVar23,&s,&local_68);
          archive_entry_set_birthtime(entry,s,local_68);
        }
        iVar3 = bcmp(local_90,"LIBARCHIVE.xattr.",0x11);
        if ((iVar3 == 0) && (sVar6 = strlen((char *)local_90), 0x11 < sVar6)) {
          local_90 = local_90 + 0x11;
          sVar6 = strlen((char *)local_90);
          pbVar8 = (byte *)malloc(sVar6 + 1);
          pbVar15 = pbVar8;
          if (pbVar8 != (byte *)0x0) {
            do {
              local_48 = pbVar15;
              bVar18 = *local_90;
              if (bVar18 == 0x25) {
                if ((local_90[1] == 0) || (bVar1 = local_90[2], bVar1 == 0)) goto LAB_003f4f5c;
                local_4c = tohex((int)(char)local_90[1]);
                wVar4 = tohex((int)(char)bVar1);
                if ((local_4c | wVar4) < 0) goto LAB_003f4f5c;
                local_90 = local_90 + 3;
                bVar18 = (byte)(local_4c << 4) | (byte)wVar4;
              }
              else {
                if (bVar18 == 0) goto LAB_003f51ec;
LAB_003f4f5c:
                local_90 = local_90 + 1;
              }
              *pbVar8 = bVar18;
              pbVar8 = pbVar8 + 1;
              pbVar15 = local_48;
            } while( true );
          }
        }
        goto LAB_003f53cd;
      }
      if (bVar18 == 0x47) {
        iVar3 = strcmp((char *)local_90,"GNU.sparse.numblocks");
        if (iVar3 == 0) {
          *(undefined4 *)local_58 = 0xffffffff;
          *(undefined4 *)((long)local_58 + 4) = 0xffffffff;
          *(undefined4 *)(local_58 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_58 + 0xc) = 0xffffffff;
          tar->sparse_gnu_major = 0;
          tar->sparse_gnu_minor = 0;
        }
        iVar3 = strcmp((char *)local_90,"GNU.sparse.offset");
        if (iVar3 == 0) {
          sVar6 = strlen((char *)pbVar23);
          iVar7 = tar_atol10((char *)pbVar23,sVar6);
          tar->sparse_offset = iVar7;
          if (tar->sparse_numbytes != -1) {
            wVar4 = gnu_add_sparse_entry(a,tar,iVar7,tar->sparse_numbytes);
            if (wVar4 != L'\0') goto LAB_003f57c2;
            *(undefined4 *)local_58 = 0xffffffff;
            *(undefined4 *)((long)local_58 + 4) = 0xffffffff;
            *(undefined4 *)(local_58 + 1) = 0xffffffff;
            *(undefined4 *)((long)local_58 + 0xc) = 0xffffffff;
          }
        }
        iVar3 = strcmp((char *)local_90,"GNU.sparse.numbytes");
        if (iVar3 == 0) {
          sVar6 = strlen((char *)pbVar23);
          iVar7 = tar_atol10((char *)pbVar23,sVar6);
          tar->sparse_numbytes = iVar7;
          if (iVar7 != -1) {
            wVar4 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar7);
            if (wVar4 != L'\0') goto LAB_003f57c2;
            *(undefined4 *)local_58 = 0xffffffff;
            *(undefined4 *)((long)local_58 + 4) = 0xffffffff;
            *(undefined4 *)(local_58 + 1) = 0xffffffff;
            *(undefined4 *)((long)local_58 + 0xc) = 0xffffffff;
          }
        }
        iVar3 = strcmp((char *)local_90,"GNU.sparse.size");
        if (iVar3 == 0) {
          sVar6 = strlen((char *)pbVar23);
          iVar7 = tar_atol10((char *)pbVar23,sVar6);
          tar->realsize = iVar7;
          archive_entry_set_size(entry,iVar7);
        }
        iVar3 = strcmp((char *)local_90,"GNU.sparse.map");
        if (iVar3 == 0) {
          tar->sparse_gnu_major = 0;
          tar->sparse_gnu_minor = 1;
          local_70 = -1;
          pbVar15 = pbVar23;
          do {
            for (sVar21 = 0; (bVar18 = pbVar15[sVar21], bVar18 != 0 && (bVar18 != 0x2c));
                sVar21 = sVar21 + 1) {
              if ((byte)(bVar18 - 0x3a) < 0xf6) {
                wVar4 = L'\xffffffec';
                goto LAB_003f553c;
              }
            }
            iVar7 = tar_atol10((char *)pbVar15,sVar21);
            if (local_70 < 0) {
              if (iVar7 < 0) goto LAB_003f5424;
            }
            else {
              if (iVar7 < 0) {
LAB_003f5424:
                wVar4 = L'\xffffffec';
                goto switchD_003f4820_caseD_62;
              }
              wVar4 = gnu_add_sparse_entry(a,tar,local_70,iVar7);
              if (wVar4 != L'\0') goto LAB_003f5515;
              bVar18 = pbVar15[sVar21];
              iVar7 = -1;
            }
            pbVar15 = pbVar15 + sVar21 + 1;
            local_70 = iVar7;
          } while (bVar18 != 0);
        }
        iVar3 = strcmp((char *)local_90,"GNU.sparse.major");
        if (iVar3 == 0) {
          sVar6 = strlen((char *)pbVar23);
          iVar7 = tar_atol10((char *)pbVar23,sVar6);
          tar->sparse_gnu_major = (int)iVar7;
          tar->sparse_gnu_pending = '\x01';
        }
        iVar3 = strcmp((char *)local_90,"GNU.sparse.minor");
        if (iVar3 == 0) {
          sVar6 = strlen((char *)pbVar23);
          iVar7 = tar_atol10((char *)pbVar23,sVar6);
          tar->sparse_gnu_minor = (int)iVar7;
          tar->sparse_gnu_pending = '\x01';
        }
        iVar3 = strcmp((char *)local_90,"GNU.sparse.name");
        if (iVar3 == 0) {
          (tar->entry_pathname_override).length = 0;
          sVar6 = strlen((char *)pbVar23);
          archive_strncat(&tar->entry_pathname_override,pbVar23,sVar6);
        }
        iVar3 = strcmp((char *)local_90,"GNU.sparse.realsize");
        wVar4 = L'\0';
        if (iVar3 == 0) {
LAB_003f4a7b:
          sVar6 = strlen((char *)pbVar23);
          iVar7 = tar_atol10((char *)pbVar23,sVar6);
          tar->realsize = iVar7;
          archive_entry_set_size(entry,iVar7);
          wVar4 = L'\0';
        }
        break;
      }
      goto LAB_003f53cd;
    }
    iVar3 = strcmp((char *)local_90,"SCHILY.acl.access");
    if (iVar3 == 0) {
      if (tar->sconv_acl == (archive_string_conv *)0x0) {
        paVar9 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
        tar->sconv_acl = paVar9;
        if (paVar9 == (archive_string_conv *)0x0) goto LAB_003f57c2;
      }
      paVar10 = archive_entry_acl(entry);
      wVar4 = archive_acl_parse_l(paVar10,(char *)pbVar23,L'Ā',tar->sconv_acl);
      if (wVar4 == L'\0') break;
      if (wVar4 != L'\xffffffe2') {
        pcVar17 = "Parse error: SCHILY.acl.access";
LAB_003f5193:
        archive_set_error(&a->archive,-1,pcVar17);
        goto LAB_003f553c;
      }
      local_40 = "Can\'t allocate memory for SCHILY.acl.access";
LAB_003f57b0:
      archive_set_error(&a->archive,0xc,local_40);
      goto LAB_003f57c2;
    }
    iVar3 = strcmp((char *)local_90,"SCHILY.acl.default");
    if (iVar3 != 0) {
      iVar3 = strcmp((char *)local_90,"SCHILY.devmajor");
      if (iVar3 == 0) {
        sVar6 = strlen((char *)pbVar23);
        dVar12 = tar_atol10((char *)pbVar23,sVar6);
        archive_entry_set_rdevmajor(entry,dVar12);
        wVar4 = wVar20;
      }
      else {
        iVar3 = strcmp((char *)local_90,"SCHILY.devminor");
        if (iVar3 == 0) {
          sVar6 = strlen((char *)pbVar23);
          dVar12 = tar_atol10((char *)pbVar23,sVar6);
          archive_entry_set_rdevminor(entry,dVar12);
          wVar4 = wVar20;
        }
        else {
          iVar3 = strcmp((char *)local_90,"SCHILY.fflags");
          if (iVar3 == 0) {
            archive_entry_copy_fflags_text(entry,(char *)pbVar23);
            wVar4 = wVar20;
          }
          else {
            iVar3 = strcmp((char *)local_90,"SCHILY.dev");
            if (iVar3 == 0) {
              sVar6 = strlen((char *)pbVar23);
              dVar12 = tar_atol10((char *)pbVar23,sVar6);
              archive_entry_set_dev(entry,dVar12);
              wVar4 = wVar20;
            }
            else {
              iVar3 = strcmp((char *)local_90,"SCHILY.ino");
              if (iVar3 == 0) {
                sVar6 = strlen((char *)pbVar23);
                iVar7 = tar_atol10((char *)pbVar23,sVar6);
                archive_entry_set_ino(entry,iVar7);
                wVar4 = wVar20;
              }
              else {
                iVar3 = strcmp((char *)local_90,"SCHILY.nlink");
                if (iVar3 != 0) {
                  iVar3 = strcmp((char *)local_90,"SCHILY.realsize");
                  if (iVar3 == 0) goto LAB_003f4a7b;
                  iVar3 = strcmp((char *)local_90,"SUN.holesdata");
                  if (iVar3 == 0) {
                    if (*pbVar23 != 0x20) {
LAB_003f54fc:
                      archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
LAB_003f5515:
                      wVar4 = L'\xffffffec';
                      break;
                    }
                    local_90 = (byte *)0x0;
                    uVar16 = 1;
                    do {
                      pbVar23 = pbVar23 + 1;
                      for (sVar21 = 0; bVar18 = pbVar23[sVar21], (bVar18 & 0xdf) != 0;
                          sVar21 = sVar21 + 1) {
                        if ((byte)(bVar18 - 0x3a) < 0xf6) goto LAB_003f54fc;
                      }
                      iVar7 = tar_atol10((char *)pbVar23,sVar21);
                      if (iVar7 < 0) goto LAB_003f54fc;
                      pbVar23 = pbVar23 + sVar21;
                      if (iVar7 - (long)local_90 != 0 && (long)local_90 <= iVar7) {
                        wVar4 = gnu_add_sparse_entry(a,tar,(int64_t)local_90,iVar7 - (long)local_90)
                        ;
                        if (wVar4 != L'\0') goto LAB_003f57c2;
                        tar->sparse_last->hole = uVar16;
                        bVar18 = *pbVar23;
                      }
                      uVar16 = uVar16 ^ 1;
                      local_90 = (byte *)iVar7;
                    } while (bVar18 != 0);
                  }
                  goto LAB_003f53cd;
                }
                sVar6 = strlen((char *)pbVar23);
                iVar7 = tar_atol10((char *)pbVar23,sVar6);
                archive_entry_set_nlink(entry,(uint)iVar7);
                wVar4 = L'\0';
              }
            }
          }
        }
      }
      break;
    }
    if (tar->sconv_acl == (archive_string_conv *)0x0) {
      paVar9 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      tar->sconv_acl = paVar9;
      if (paVar9 == (archive_string_conv *)0x0) goto LAB_003f57c2;
    }
    paVar10 = archive_entry_acl(entry);
    wVar4 = archive_acl_parse_l(paVar10,(char *)pbVar23,L'Ȁ',tar->sconv_acl);
    if (wVar4 != L'\0') {
      if (wVar4 == L'\xffffffe2') goto LAB_003f57b0;
      pcVar17 = "Parse error: SCHILY.acl.default";
      goto LAB_003f5193;
    }
  }
switchD_003f4820_caseD_62:
  goto LAB_003f553c;
LAB_003f51ec:
  *pbVar8 = 0;
  sVar6 = strlen((char *)pbVar23);
  if (base64_decode_decode_table[0x42] != '\x01') {
    base64_decode_decode_table._112_4_ = 0xffffffff;
    base64_decode_decode_table._116_4_ = 0xffffffff;
    base64_decode_decode_table._120_4_ = 0xffffffff;
    base64_decode_decode_table._124_4_ = 0xffffffff;
    base64_decode_decode_table._96_4_ = 0xffffffff;
    base64_decode_decode_table._100_4_ = 0xffffffff;
    base64_decode_decode_table._104_4_ = 0xffffffff;
    base64_decode_decode_table._108_4_ = 0xffffffff;
    base64_decode_decode_table._80_4_ = 0xffffffff;
    base64_decode_decode_table._84_4_ = 0xffffffff;
    base64_decode_decode_table._88_4_ = 0xffffffff;
    base64_decode_decode_table._92_4_ = 0xffffffff;
    base64_decode_decode_table._64_4_ = 0xffffffff;
    base64_decode_decode_table._68_4_ = 0xffffffff;
    base64_decode_decode_table._72_4_ = 0xffffffff;
    base64_decode_decode_table._76_4_ = 0xffffffff;
    base64_decode_decode_table._48_4_ = 0xffffffff;
    base64_decode_decode_table._52_4_ = 0xffffffff;
    base64_decode_decode_table._56_4_ = 0xffffffff;
    base64_decode_decode_table._60_4_ = 0xffffffff;
    base64_decode_decode_table._32_4_ = 0xffffffff;
    base64_decode_decode_table._36_4_ = 0xffffffff;
    base64_decode_decode_table._40_4_ = 0xffffffff;
    base64_decode_decode_table._44_4_ = 0xffffffff;
    base64_decode_decode_table._16_4_ = 0xffffffff;
    base64_decode_decode_table._20_4_ = 0xffffffff;
    base64_decode_decode_table._24_4_ = 0xffffffff;
    base64_decode_decode_table._28_4_ = 0xffffffff;
    base64_decode_decode_table._0_4_ = 0xffffffff;
    base64_decode_decode_table._4_4_ = 0xffffffff;
    base64_decode_decode_table._8_4_ = 0xffffffff;
    base64_decode_decode_table._12_4_ = 0xffffffff;
    for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 1) {
      base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar11]] = (char)lVar11;
    }
  }
  value = (byte *)malloc((sVar6 - (sVar6 >> 2)) + 1);
  pbVar15 = local_48;
  pbVar8 = value;
  if (value != (byte *)0x0) {
    while (sVar6 != 0) {
      uVar19 = 0;
      uVar16 = 0;
      while( true ) {
        if ((3 < uVar16) || (sVar6 == 0)) goto LAB_003f52a7;
        bVar18 = *pbVar23;
        if ((bVar18 == 0x3d) || (bVar18 == 0x5f)) break;
        if (((char)bVar18 < ' ') || ((byte)base64_decode_decode_table[bVar18] == 0xff)) {
          pbVar23 = pbVar23 + 1;
          sVar6 = sVar6 - 1;
        }
        else {
          pbVar23 = pbVar23 + 1;
          uVar19 = uVar19 << 6 | (uint)(byte)base64_decode_decode_table[bVar18];
          sVar6 = sVar6 - 1;
          uVar16 = uVar16 + 1;
        }
      }
      sVar6 = 0;
LAB_003f52a7:
      iVar3 = uVar19 << (('\x04' - (char)uVar16) * '\x06' & 0x1fU);
      if (uVar16 == 2) {
LAB_003f52cf:
        *pbVar8 = (byte)((uint)iVar3 >> 0x10);
      }
      else {
        if (uVar16 == 3) {
LAB_003f52cc:
          pbVar8[1] = (byte)((uint)iVar3 >> 8);
          goto LAB_003f52cf;
        }
        if (uVar16 == 4) {
          pbVar8[2] = (byte)iVar3;
          goto LAB_003f52cc;
        }
      }
      pbVar8 = pbVar8 + (uVar16 * 3 >> 2);
    }
    archive_entry_xattr_add_entry(entry,(char *)local_48,value,(long)pbVar8 - (long)value);
    free(pbVar15);
    pbVar15 = value;
  }
  free(pbVar15);
LAB_003f53cd:
  wVar4 = L'\0';
LAB_003f553c:
  if (wVar4 <= local_c4) {
    local_c4 = wVar4;
  }
  pbVar15 = local_38 + uVar22;
  uVar5 = uVar5 - uVar22;
  goto LAB_003f4726;
LAB_003f55ae:
  if (tar->pax_hdrcharset_binary == 0) {
    paVar9 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (paVar9 != (archive_string_conv *)0x0) {
      if (tar->compat_2x != 0) {
        archive_string_conversion_set_opt(paVar9,L'\x01');
      }
      goto LAB_003f55de;
    }
  }
  else {
    paVar9 = tar->opt_sconv;
LAB_003f55de:
    sVar21 = (tar->entry_gname).length;
    if ((sVar21 != 0) &&
       (wVar4 = _archive_entry_copy_gname_l(entry,paVar13->s,sVar21,paVar9), wVar4 != L'\0')) {
      local_c4 = set_conversion_failed_error(a,paVar9,"Gname");
      if (local_c4 == L'\xffffffe2') goto LAB_003f57c2;
      archive_entry_copy_gname(entry,paVar13->s);
    }
    sVar21 = (tar->entry_linkpath).length;
    if ((sVar21 != 0) &&
       (wVar4 = _archive_entry_copy_link_l(entry,as->s,sVar21,paVar9), wVar4 != L'\0')) {
      local_c4 = set_conversion_failed_error(a,paVar9,"Linkname");
      if (local_c4 == L'\xffffffe2') goto LAB_003f57c2;
      archive_entry_copy_link(entry,as->s);
    }
    paVar13 = &tar->entry_pathname_override;
    if ((((tar->entry_pathname_override).length != 0) ||
        (paVar13 = &tar->entry_pathname, (tar->entry_pathname).length != 0)) &&
       (wVar4 = _archive_entry_copy_pathname_l(entry,paVar13->s,paVar13->length,paVar9),
       wVar4 != L'\0')) {
      local_c4 = set_conversion_failed_error(a,paVar9,"Pathname");
      if (local_c4 == L'\xffffffe2') goto LAB_003f57c2;
      archive_entry_copy_pathname(entry,paVar13->s);
    }
    sVar21 = (tar->entry_uname).length;
    if ((sVar21 == 0) ||
       (wVar4 = _archive_entry_copy_uname_l(entry,as_00->s,sVar21,paVar9), wVar4 == L'\0'))
    goto LAB_003f5582;
    local_c4 = set_conversion_failed_error(a,paVar9,"Uname");
    if (local_c4 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,as_00->s);
      goto LAB_003f5582;
    }
  }
LAB_003f57c2:
  local_c4 = L'\xffffffe2';
LAB_003f5582:
  if (wVar2 < local_c4) {
    local_c4 = wVar2;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return local_c4;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, tar->pax_header.s);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}